

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::_InternalParse
          (TreeEnsembleParameters_TreeNode *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  Rep *pRVar2;
  bool bVar3;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *obj;
  MessageLite *msg;
  ulong uVar4;
  int iVar5;
  char cVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double *p;
  pair<const_char_*,_unsigned_int> pVar8;
  pair<const_char_*,_unsigned_long> pVar9;
  double *local_40;
  InternalMetadata *local_38;
  
  local_40 = (double *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar3) {
    local_38 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_40;
      uVar7 = (uint)bVar1;
      p = (double *)((long)local_40 + 1);
      if ((char)bVar1 < '\0') {
        uVar7 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          pVar8 = google::protobuf::internal::ReadTagFallback((char *)local_40,uVar7);
          p = (double *)pVar8.first;
          uVar7 = pVar8.second;
        }
        else {
          p = (double *)((long)local_40 + 2);
        }
      }
      cVar6 = (char)uVar7;
      local_40 = p;
      switch(uVar7 >> 3) {
      case 1:
        if (cVar6 != '\b') break;
        uVar4 = (ulong)(char)*(byte *)p;
        local_40 = (double *)((long)p + 1);
        if (-1 < (long)uVar4) {
LAB_002c5f7c:
          this->treeid_ = uVar4;
          goto LAB_002c6235;
        }
        uVar7 = ((uint)*(byte *)local_40 * 0x80 + (uint)*(byte *)p) - 0x80;
        if (-1 < (char)*(byte *)local_40) {
          uVar4 = (ulong)uVar7;
          local_40 = (double *)((long)p + 2);
          goto LAB_002c5f7c;
        }
        local_40 = p;
        pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
        local_40 = (double *)pVar9.first;
        this->treeid_ = pVar9.second;
        goto LAB_002c622c;
      case 2:
        if (cVar6 != '\x10') break;
        uVar4 = (ulong)(char)*(byte *)p;
        local_40 = (double *)((long)p + 1);
        if ((long)uVar4 < 0) {
          uVar7 = ((uint)*(byte *)local_40 * 0x80 + (uint)*(byte *)p) - 0x80;
          if ((char)*(byte *)local_40 < '\0') {
            local_40 = p;
            pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
            local_40 = (double *)pVar9.first;
            this->nodeid_ = pVar9.second;
            goto LAB_002c622c;
          }
          uVar4 = (ulong)uVar7;
          local_40 = (double *)((long)p + 2);
        }
        this->nodeid_ = uVar4;
        goto LAB_002c6235;
      case 3:
        if (cVar6 == '\x18') {
          uVar4 = (ulong)(char)*(byte *)p;
          local_40 = (double *)((long)p + 1);
          if ((long)uVar4 < 0) {
            uVar7 = ((uint)*(byte *)local_40 * 0x80 + (uint)*(byte *)p) - 0x80;
            if (-1 < (char)*(byte *)local_40) {
              uVar4 = (ulong)uVar7;
              local_40 = (double *)((long)p + 2);
              goto LAB_002c60cb;
            }
            local_40 = p;
            pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
            iVar5 = (int)pVar9.second;
            local_40 = (double *)pVar9.first;
            if (local_40 == (double *)0x0) {
              return (char *)0x0;
            }
          }
          else {
LAB_002c60cb:
            iVar5 = (int)uVar4;
          }
          this->nodebehavior_ = iVar5;
          goto LAB_002c6235;
        }
        break;
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
      case 9:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
        break;
      case 10:
        if (cVar6 == 'P') {
          uVar4 = (ulong)(char)*(byte *)p;
          local_40 = (double *)((long)p + 1);
          if ((long)uVar4 < 0) {
            uVar7 = ((uint)*(byte *)local_40 * 0x80 + (uint)*(byte *)p) - 0x80;
            if ((char)*(byte *)local_40 < '\0') {
              local_40 = p;
              pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
              local_40 = (double *)pVar9.first;
              this->branchfeatureindex_ = pVar9.second;
              goto LAB_002c622c;
            }
            uVar4 = (ulong)uVar7;
            local_40 = (double *)((long)p + 2);
          }
          this->branchfeatureindex_ = uVar4;
          goto LAB_002c6235;
        }
        break;
      case 0xb:
        if (cVar6 == 'Y') {
          this->branchfeaturevalue_ = *p;
LAB_002c603f:
          local_40 = p + 1;
          goto LAB_002c6235;
        }
        break;
      case 0xc:
        if (cVar6 == '`') {
          uVar4 = (ulong)(char)*(byte *)p;
          local_40 = (double *)((long)p + 1);
          if ((long)uVar4 < 0) {
            uVar7 = ((uint)*(byte *)local_40 * 0x80 + (uint)*(byte *)p) - 0x80;
            if ((char)*(byte *)local_40 < '\0') {
              local_40 = p;
              pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
              local_40 = (double *)pVar9.first;
              this->truechildnodeid_ = pVar9.second;
              goto LAB_002c622c;
            }
            uVar4 = (ulong)uVar7;
            local_40 = (double *)((long)p + 2);
          }
          this->truechildnodeid_ = uVar4;
          goto LAB_002c6235;
        }
        break;
      case 0xd:
        if (cVar6 == 'h') {
          uVar4 = (ulong)(char)*(byte *)p;
          local_40 = (double *)((long)p + 1);
          if ((long)uVar4 < 0) {
            uVar7 = ((uint)*(byte *)local_40 * 0x80 + (uint)*(byte *)p) - 0x80;
            if ((char)*(byte *)local_40 < '\0') {
              local_40 = p;
              pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
              local_40 = (double *)pVar9.first;
              this->falsechildnodeid_ = pVar9.second;
              goto LAB_002c622c;
            }
            uVar4 = (ulong)uVar7;
            local_40 = (double *)((long)p + 2);
          }
          this->falsechildnodeid_ = uVar4;
          goto LAB_002c6235;
        }
        break;
      case 0xe:
        if (cVar6 == 'p') {
          uVar4 = (ulong)(char)*(byte *)p;
          local_40 = (double *)((long)p + 1);
          if ((long)uVar4 < 0) {
            uVar7 = ((uint)*(byte *)local_40 * 0x80 + (uint)*(byte *)p) - 0x80;
            if ((char)*(byte *)local_40 < '\0') {
              local_40 = p;
              pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
              local_40 = (double *)pVar9.first;
              this->missingvaluetrackstruechild_ = pVar9.second != 0;
              goto LAB_002c622c;
            }
            uVar4 = (ulong)uVar7;
            local_40 = (double *)((long)p + 2);
          }
          this->missingvaluetrackstruechild_ = uVar4 != 0;
          goto LAB_002c6235;
        }
        break;
      case 0x14:
        if (cVar6 == -0x5e) {
          local_40 = (double *)((long)p + -2);
          do {
            local_40 = (double *)((long)local_40 + 2);
            pRVar2 = (this->evaluationinfo_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar2 == (Rep *)0x0) {
LAB_002c5fe2:
              obj = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
                              ((this->evaluationinfo_).super_RepeatedPtrFieldBase.arena_);
              msg = (MessageLite *)
                    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                              (&(this->evaluationinfo_).super_RepeatedPtrFieldBase,obj);
            }
            else {
              iVar5 = (this->evaluationinfo_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar2->allocated_size <= iVar5) goto LAB_002c5fe2;
              (this->evaluationinfo_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
              msg = (MessageLite *)pRVar2->elements[iVar5];
            }
            local_40 = (double *)
                       google::protobuf::internal::ParseContext::ParseMessage
                                 (ctx,msg,(char *)local_40);
            if (local_40 == (double *)0x0) {
              return (char *)0x0;
            }
          } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                  (*(short *)local_40 == 0x1a2));
          goto LAB_002c6235;
        }
        break;
      default:
        if ((uVar7 >> 3 == 0x1e) && (cVar6 == -0xf)) {
          this->relativehitrate_ = *p;
          goto LAB_002c603f;
        }
      }
      if ((uVar7 == 0) || ((uVar7 & 7) == 4)) {
        if (p == (double *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar7 - 1;
        return (char *)p;
      }
      if ((local_38->ptr_ & 1U) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(local_38);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((local_38->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      local_40 = (double *)
                 google::protobuf::internal::UnknownFieldParse(uVar7,unknown,(char *)local_40,ctx);
LAB_002c622c:
      if (local_40 == (double *)0x0) {
        return (char *)0x0;
      }
LAB_002c6235:
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_40;
}

Assistant:

const char* TreeEnsembleParameters_TreeNode::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint64 treeId = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          treeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 nodeId = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          nodeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_nodebehavior(static_cast<::CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior>(val));
        } else
          goto handle_unusual;
        continue;
      // uint64 branchFeatureIndex = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          branchfeatureindex_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // double branchFeatureValue = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 89)) {
          branchfeaturevalue_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // uint64 trueChildNodeId = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 96)) {
          truechildnodeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 falseChildNodeId = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 104)) {
          falsechildnodeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool missingValueTracksTrueChild = 14;
      case 14:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 112)) {
          missingvaluetrackstruechild_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_evaluationinfo(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<162>(ptr));
        } else
          goto handle_unusual;
        continue;
      // double relativeHitRate = 30;
      case 30:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 241)) {
          relativehitrate_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}